

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::Hashing::hash_pnext_struct
               (StateRecorder *param_1,Hasher *h,VkPipelineSampleLocationsStateCreateInfoEXT *info,
               DynamicStateInfo *dynamic_state_info)

{
  uint32_t local_4c;
  byte local_3a;
  byte local_39;
  uint local_38;
  uint32_t i;
  bool dynamic_locations;
  bool dynamic_enable;
  DynamicStateInfo *dynamic_state_info_local;
  VkPipelineSampleLocationsStateCreateInfoEXT *info_local;
  Hasher *h_local;
  StateRecorder *param_0_local;
  
  local_39 = 0;
  if (dynamic_state_info != (DynamicStateInfo *)0x0) {
    local_39 = dynamic_state_info->sample_locations_enable;
  }
  local_3a = 0;
  if (dynamic_state_info != (DynamicStateInfo *)0x0) {
    local_3a = dynamic_state_info->sample_locations;
  }
  if ((local_39 & 1) == 0) {
    local_4c = info->sampleLocationsEnable;
  }
  else {
    local_4c = 0;
  }
  Hasher::u32(h,local_4c);
  if ((((local_39 & 1) == 0) && (info->sampleLocationsEnable == 0)) || ((local_3a & 1) != 0)) {
    Hasher::u32(h,0);
  }
  else {
    if ((info->sampleLocationsInfo).pNext != (void *)0x0) {
      return false;
    }
    Hasher::u32(h,(info->sampleLocationsInfo).sampleLocationGridSize.width);
    Hasher::u32(h,(info->sampleLocationsInfo).sampleLocationGridSize.height);
    Hasher::u32(h,(info->sampleLocationsInfo).sampleLocationsPerPixel);
    Hasher::u32(h,(info->sampleLocationsInfo).sampleLocationsCount);
    for (local_38 = 0; local_38 < (info->sampleLocationsInfo).sampleLocationsCount;
        local_38 = local_38 + 1) {
      Hasher::f32(h,(info->sampleLocationsInfo).pSampleLocations[local_38].x);
      Hasher::f32(h,(info->sampleLocationsInfo).pSampleLocations[local_38].y);
    }
  }
  return true;
}

Assistant:

static bool hash_pnext_struct(const StateRecorder *,
                              Hasher &h,
                              const VkPipelineSampleLocationsStateCreateInfoEXT &info,
                              const DynamicStateInfo *dynamic_state_info)
{
	bool dynamic_enable = dynamic_state_info && dynamic_state_info->sample_locations_enable;
	bool dynamic_locations = dynamic_state_info && dynamic_state_info->sample_locations;
	h.u32(dynamic_enable ? 0 : info.sampleLocationsEnable);
	if ((dynamic_enable || info.sampleLocationsEnable) && !dynamic_locations)
	{
		if (info.sampleLocationsInfo.pNext)
			return false;

		h.u32(info.sampleLocationsInfo.sampleLocationGridSize.width);
		h.u32(info.sampleLocationsInfo.sampleLocationGridSize.height);
		h.u32(info.sampleLocationsInfo.sampleLocationsPerPixel);
		h.u32(info.sampleLocationsInfo.sampleLocationsCount);
		for (uint32_t i = 0; i < info.sampleLocationsInfo.sampleLocationsCount; i++)
		{
			h.f32(info.sampleLocationsInfo.pSampleLocations[i].x);
			h.f32(info.sampleLocationsInfo.pSampleLocations[i].y);
		}
	}
	else
		h.u32(0);

	return true;
}